

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeQPRRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  if ((RegNo & 0xffffffe1) != 0) {
    return MCDisassembler_Fail;
  }
  MCOperand_CreateReg0(Inst,(uint)*(ushort *)((long)QPRDecoderTable + (ulong)RegNo));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeQPRRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	unsigned Register;
	if (RegNo > 31 || (RegNo & 1) != 0)
		return MCDisassembler_Fail;
	RegNo >>= 1;

	Register = QPRDecoderTable[RegNo];
	MCOperand_CreateReg0(Inst, Register);
	return MCDisassembler_Success;
}